

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestRegistry::getFilteredTests
          (TestRegistry *this,TestSpec *testSpec,IConfig *config,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  pointer __x;
  
  pTVar1 = (this->m_functionsInOrder).
           super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (this->m_functionsInOrder).
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pTVar1; __x = __x + 1) {
    bVar2 = TestSpec::matches(testSpec,&__x->super_TestCaseInfo);
    if (bVar2) {
      iVar3 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(config);
      if (((char)iVar3 != '\0') || (((__x->super_TestCaseInfo).properties & Throws) == None)) {
        std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                  (matchingTestCases,__x);
      }
    }
  }
  return;
}

Assistant:

virtual void getFilteredTests( TestSpec const& testSpec, IConfig const& config, std::vector<TestCase>& matchingTestCases ) const {
            for( std::vector<TestCase>::const_iterator  it = m_functionsInOrder.begin(),
                                                        itEnd = m_functionsInOrder.end();
                    it != itEnd;
                    ++it ) {
                if( testSpec.matches( *it ) && ( config.allowThrows() || !it->throws() ) )
                    matchingTestCases.push_back( *it );
            }
        }